

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  bool bVar1;
  ldmParams_t params_00;
  ldmParams_t params_01;
  uint uVar2;
  U32 UVar3;
  U64 UVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ZSTD_compressedBlockState_t *pZVar9;
  seqDef *psVar10;
  BYTE *pBVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  rawSeq *__s;
  uint *puVar16;
  size_t sVar17;
  ZSTD_CCtx_params *pZVar18;
  uint *puVar19;
  ZSTD_CCtx_params *pZVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  size_t __n;
  byte bVar24;
  
  uVar2 = params.cParams.windowLog;
  bVar24 = 0;
  params.cParams.windowLog = uVar2;
  if ((((crp == ZSTDcrp_continue) &&
       ((params.cParams.minMatch == 3) == ((zc->appliedParams).cParams.minMatch == 3))) &&
      ((zc->appliedParams).cParams.chainLog == params.cParams.chainLog)) &&
     (((zc->appliedParams).cParams.hashLog == params.cParams.hashLog &&
      ((zc->appliedParams).cParams.strategy == params.cParams.strategy)))) {
    UVar3 = (zc->appliedParams).ldmParams.enableLdm;
    if ((UVar3 == 0 && params.ldmParams.enableLdm == 0) ||
       (((UVar3 == params.ldmParams.enableLdm &&
         ((zc->appliedParams).ldmParams.hashLog == params.ldmParams.hashLog)) &&
        (((zc->appliedParams).ldmParams.bucketSizeLog == params.ldmParams.bucketSizeLog &&
         (((zc->appliedParams).ldmParams.minMatchLength == params.ldmParams.minMatchLength &&
          ((zc->appliedParams).ldmParams.hashRateLog == params.ldmParams.hashRateLog)))))))) {
      uVar22 = 1L << ((byte)params.cParams.windowLog & 0x3f);
      if (pledgedSrcSize <= uVar22) {
        uVar22 = pledgedSrcSize;
      }
      if (pledgedSrcSize == 0) {
        uVar22 = 1;
      }
      uVar12 = 0x20000;
      if (uVar22 < 0x20000) {
        uVar12 = uVar22;
      }
      if ((((uVar12 / ((ulong)(params.cParams.minMatch != 3) + 3) <= (zc->seqStore).maxNbSeq) &&
           (uVar12 <= (zc->seqStore).maxNbLit)) &&
          (zbuff != ZSTDb_buffered || uVar22 + uVar12 <= zc->inBuffSize)) &&
         (iVar15 = (uint)(0 < zc->workSpaceOversizedDuration) + zc->workSpaceOversizedDuration,
         zc->workSpaceOversizedDuration = iVar15, iVar15 < 0x81)) {
        uVar22 = 1L << ((byte)params.cParams.windowLog & 0x3f);
        if (pledgedSrcSize <= uVar22) {
          uVar22 = pledgedSrcSize;
        }
        if (0x1ffff < uVar22) {
          uVar22 = 0x20000;
        }
        if (pledgedSrcSize == 0) {
          uVar22 = 1;
        }
        zc->blockSize = uVar22;
        (zc->appliedParams).format = params.format;
        (zc->appliedParams).cParams.windowLog = uVar2;
        puVar16 = &params.cParams.chainLog;
        puVar19 = &(zc->appliedParams).cParams.chainLog;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          *(undefined8 *)puVar19 = *(undefined8 *)puVar16;
          puVar16 = puVar16 + 2;
          puVar19 = puVar19 + 2;
        }
        (zc->appliedParams).ldmParams.enableLdm = params.ldmParams.enableLdm;
        (zc->appliedParams).customMem.customFree = params.customMem.customFree;
        (zc->appliedParams).customMem.opaque = params.customMem.opaque;
        *(undefined8 *)&(zc->appliedParams).ldmParams.windowLog = params._100_8_;
        *(long *)((long)&(zc->appliedParams).customMem.customAlloc + 4) = params.customMem._4_8_;
        (zc->appliedParams).ldmParams.hashLog = (int)params.ldmParams._4_8_;
        (zc->appliedParams).ldmParams.bucketSizeLog = (int)((ulong)params.ldmParams._4_8_ >> 0x20);
        (zc->appliedParams).ldmParams.minMatchLength = (int)params.ldmParams._12_8_;
        (zc->appliedParams).ldmParams.hashRateLog = (int)((ulong)params.ldmParams._12_8_ >> 0x20);
        (zc->blockState).matchState.cParams.windowLog = uVar2;
        (zc->blockState).matchState.cParams.chainLog = (int)params.cParams._4_8_;
        (zc->blockState).matchState.cParams.hashLog = (int)((ulong)params.cParams._4_8_ >> 0x20);
        (zc->blockState).matchState.cParams.searchLog = (int)params.cParams._12_8_;
        (zc->blockState).matchState.cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
        (zc->blockState).matchState.cParams.targetLength = (int)params.cParams._20_8_;
        (zc->blockState).matchState.cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
        zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize + 1 == 0) {
          (zc->appliedParams).fParams.contentSizeFlag = 0;
        }
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        if (params.ldmParams.enableLdm != 0) {
          UVar3 = *(int *)&(zc->ldmState).window.nextSrc - *(int *)&(zc->ldmState).window.base;
          (zc->ldmState).window.lowLimit = UVar3;
          (zc->ldmState).window.dictLimit = UVar3;
        }
        if ((zc->appliedParams).ldmParams.enableLdm == 0) {
          (zc->externSeqStore).size = 0;
          (zc->externSeqStore).capacity = 0;
          (zc->externSeqStore).seq = (rawSeq *)0x0;
          (zc->externSeqStore).pos = 0;
        }
        UVar3 = *(int *)&(zc->blockState).matchState.window.nextSrc -
                *(int *)&(zc->blockState).matchState.window.base;
        (zc->blockState).matchState.window.lowLimit = UVar3;
        (zc->blockState).matchState.window.dictLimit = UVar3;
        (zc->blockState).matchState.nextToUpdate = UVar3;
        (zc->blockState).matchState.nextToUpdate3 = UVar3;
        (zc->blockState).matchState.loadedDictEnd = 0;
        (zc->blockState).matchState.opt.litLengthSum = 0;
        (zc->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        pZVar9 = (zc->blockState).prevCBlock;
        pZVar9->rep[0] = 1;
        pZVar9->rep[1] = 4;
        pZVar9->rep[2] = 8;
        (pZVar9->entropy).huf.repeatMode = HUF_repeat_none;
        (pZVar9->entropy).fse.offcode_repeatMode = FSE_repeat_none;
        (pZVar9->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
        (pZVar9->entropy).fse.litlength_repeatMode = FSE_repeat_none;
        XXH64_reset(&zc->xxhState,0);
        return 0;
      }
    }
  }
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.minMatchLength - 1 == 0) {
      UVar4 = 1;
    }
    else {
      lVar13 = -0x30e44323485a9b9d;
      UVar4 = 1;
      uVar22 = (ulong)(params.ldmParams.minMatchLength - 1);
      do {
        lVar21 = lVar13;
        if ((uVar22 & 1) == 0) {
          lVar21 = 1;
        }
        UVar4 = UVar4 * lVar21;
        lVar13 = lVar13 * lVar13;
        bVar1 = 1 < uVar22;
        uVar22 = uVar22 >> 1;
      } while (bVar1);
    }
    (zc->ldmState).hashPower = UVar4;
  }
  if (pledgedSrcSize == 0) {
    uVar22 = 1;
  }
  else {
    uVar22 = 1L << ((byte)params.cParams.windowLog & 0x3f);
    if (pledgedSrcSize <= uVar22) {
      uVar22 = pledgedSrcSize;
    }
  }
  uVar12 = 0x20000;
  if (uVar22 < 0x20000) {
    uVar12 = uVar22;
  }
  sVar17 = 0;
  uVar5 = uVar12 / ((ulong)(params.cParams.minMatch != 3) + 3);
  if (zbuff == ZSTDb_buffered) {
    uVar14 = 0;
    if (uVar22 < 0x20000) {
      uVar14 = (ulong)(0x20000U - (int)uVar12 >> 0xb);
    }
    sVar17 = uVar14 + (uVar12 >> 8) + uVar12 + 1;
  }
  iVar15 = 0;
  sVar23 = uVar22 + uVar12;
  if (zbuff != ZSTDb_buffered) {
    sVar23 = 0;
  }
  sVar6 = ZSTD_sizeof_matchState(&params.cParams,1);
  params_00.hashLog = params.ldmParams.hashLog;
  params_00.enableLdm = params.ldmParams.enableLdm;
  params_00.bucketSizeLog = params.ldmParams.bucketSizeLog;
  params_00.minMatchLength = params.ldmParams.minMatchLength;
  params_00.hashRateLog = params.ldmParams.hashRateLog;
  unique0x10000950 = params._100_8_;
  sVar7 = ZSTD_ldm_getMaxNbSeq(params_00,uVar12);
  params_01.hashLog = params.ldmParams.hashLog;
  params_01.enableLdm = params.ldmParams.enableLdm;
  params_01.bucketSizeLog = params.ldmParams.bucketSizeLog;
  params_01.minMatchLength = params.ldmParams.minMatchLength;
  params_01.hashRateLog = params.ldmParams.hashRateLog;
  unique0x100009a0 = params._100_8_;
  sVar8 = ZSTD_ldm_getTableSize(params_01);
  uVar22 = sVar23 + uVar12 + sVar17 + sVar6 + sVar8 + uVar5 + (uVar5 * 5 & 0xffffffff) * 2 +
           sVar7 * 0xc + 0x3be8;
  bVar1 = false;
  if (uVar22 * 3 < zc->workSpaceSize) {
    bVar1 = 0x80 < zc->workSpaceOversizedDuration;
    iVar15 = zc->workSpaceOversizedDuration + 1;
  }
  zc->workSpaceOversizedDuration = iVar15;
  if ((bool)(zc->workSpaceSize < uVar22 | bVar1)) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    zc->workSpaceSize = 0;
    ZSTD_free(zc->workSpace,zc->customMem);
    pZVar9 = (ZSTD_compressedBlockState_t *)ZSTD_malloc(uVar22,zc->customMem);
    zc->workSpace = pZVar9;
    if (pZVar9 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    zc->workSpaceSize = uVar22;
    zc->workSpaceOversizedDuration = 0;
    (zc->blockState).prevCBlock = pZVar9;
    (zc->blockState).nextCBlock = pZVar9 + 1;
    zc->entropyWorkspace = (U32 *)(pZVar9 + 2);
  }
  pZVar18 = &params;
  pZVar20 = &zc->appliedParams;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar2 = (pZVar18->cParams).windowLog;
    pZVar20->format = pZVar18->format;
    (pZVar20->cParams).windowLog = uVar2;
    pZVar18 = (ZSTD_CCtx_params *)((long)pZVar18 + (ulong)bVar24 * -0x10 + 8);
    pZVar20 = (ZSTD_CCtx_params *)((long)pZVar20 + (ulong)bVar24 * -0x10 + 8);
  }
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  (zc->blockState).matchState.cParams.windowLog = params.cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar12;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  pZVar9 = (zc->blockState).prevCBlock;
  pZVar9->rep[0] = 1;
  pZVar9->rep[1] = 4;
  pZVar9->rep[2] = 8;
  (pZVar9->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar9->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar9->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar9->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  __s = (rawSeq *)(zc->entropyWorkspace + 0x600);
  if (params.ldmParams.enableLdm != 0) {
    bVar24 = (byte)params.ldmParams.hashLog & 0x3f;
    memset(__s,0,8L << ((byte)params.ldmParams.hashLog & 0x3f));
    (zc->ldmState).hashTable = (ldmEntry_t *)__s;
    zc->ldmSequences = (rawSeq *)(&__s->offset + (1L << bVar24) * 2);
    __s = (rawSeq *)(&__s->offset + (1L << bVar24) * 2) + sVar7;
    zc->maxNbLdmSequences = sVar7;
    (zc->ldmState).window.nextSrc = (BYTE *)0x0;
    (zc->ldmState).window.base = (BYTE *)0x0;
    (zc->ldmState).window.dictBase = (BYTE *)0x0;
    (zc->ldmState).window.dictLimit = 0;
    (zc->ldmState).window.lowLimit = 0;
  }
  psVar10 = (seqDef *)ZSTD_reset_matchState(&(zc->blockState).matchState,__s,&params.cParams,crp,1);
  (zc->seqStore).maxNbSeq = uVar5;
  (zc->seqStore).sequencesStart = psVar10;
  (zc->seqStore).llCode = (BYTE *)(psVar10 + uVar5);
  pBVar11 = (BYTE *)((long)&psVar10[uVar5].offset + uVar5);
  (zc->seqStore).mlCode = pBVar11;
  pBVar11 = pBVar11 + uVar5;
  (zc->seqStore).ofCode = pBVar11;
  (zc->seqStore).litStart = pBVar11 + uVar5;
  (zc->seqStore).maxNbLit = uVar12;
  pBVar11 = pBVar11 + uVar5 + uVar12 + 8;
  if (params.ldmParams.enableLdm != 0) {
    __n = 1L << ((char)params.ldmParams.hashLog - (char)params.ldmParams.bucketSizeLog & 0x3fU);
    memset(pBVar11,0,__n);
    (zc->ldmState).bucketOffsets = pBVar11;
    pBVar11 = pBVar11 + __n;
    UVar3 = *(int *)&(zc->ldmState).window.nextSrc - *(int *)&(zc->ldmState).window.base;
    (zc->ldmState).window.lowLimit = UVar3;
    (zc->ldmState).window.dictLimit = UVar3;
  }
  if ((zc->stage == ZSTDcs_init) && ((zc->appliedParams).ldmParams.enableLdm == 0)) {
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).capacity = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
  }
  zc->inBuffSize = sVar23;
  zc->inBuff = (char *)pBVar11;
  zc->outBuffSize = sVar17;
  zc->outBuff = (char *)(pBVar11 + sVar23);
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    if (crp == ZSTDcrp_continue) {
        if (ZSTD_equivalentParams(zc->appliedParams, params,
                                  zc->inBuffSize,
                                  zc->seqStore.maxNbSeq, zc->seqStore.maxNbLit,
                                  zbuff, pledgedSrcSize)) {
            DEBUGLOG(4, "ZSTD_equivalentParams()==1 -> continue mode (wLog1=%u, blockSize1=%zu)",
                        zc->appliedParams.cParams.windowLog, zc->blockSize);
            zc->workSpaceOversizedDuration += (zc->workSpaceOversizedDuration > 0);   /* if it was too large, it still is */
            if (zc->workSpaceOversizedDuration <= ZSTD_WORKSPACETOOLARGE_MAXDURATION)
                return ZSTD_continueCCtx(zc, params, pledgedSrcSize);
    }   }
    DEBUGLOG(4, "ZSTD_equivalentParams()==0 -> reset CCtx");

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = WILDCOPY_OVERLENGTH + blockSize + 11*maxNbSeq;
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);
        void* ptr;   /* used to partition workSpace */

        /* Check if workSpace is large enough, alloc a new one if needed */
        {   size_t const entropySpace = HUF_WORKSPACE_SIZE;
            size_t const blockStateSpace = 2 * sizeof(ZSTD_compressedBlockState_t);
            size_t const bufferSpace = buffInSize + buffOutSize;
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = maxNbLdmSeq * sizeof(rawSeq);

            size_t const neededSpace = entropySpace + blockStateSpace + ldmSpace +
                                       ldmSeqSpace + matchStateSize + tokenSpace +
                                       bufferSpace;

            int const workSpaceTooSmall = zc->workSpaceSize < neededSpace;
            int const workSpaceTooLarge = zc->workSpaceSize > ZSTD_WORKSPACETOOLARGE_FACTOR * neededSpace;
            int const workSpaceWasteful = workSpaceTooLarge && (zc->workSpaceOversizedDuration > ZSTD_WORKSPACETOOLARGE_MAXDURATION);
            zc->workSpaceOversizedDuration = workSpaceTooLarge ? zc->workSpaceOversizedDuration+1 : 0;

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workSpaceTooSmall || workSpaceWasteful) {
                DEBUGLOG(4, "Need to resize workSpaceSize from %zuKB to %zuKB",
                            zc->workSpaceSize >> 10,
                            neededSpace >> 10);
                /* static cctx : no resize, error out */
                if (zc->staticSize) return ERROR(memory_allocation);

                zc->workSpaceSize = 0;
                ZSTD_free(zc->workSpace, zc->customMem);
                zc->workSpace = ZSTD_malloc(neededSpace, zc->customMem);
                if (zc->workSpace == NULL) return ERROR(memory_allocation);
                zc->workSpaceSize = neededSpace;
                zc->workSpaceOversizedDuration = 0;

                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(((size_t)zc->workSpace & 3) == 0);   /* ensure correct alignment */
                assert(zc->workSpaceSize >= 2 * sizeof(ZSTD_compressedBlockState_t));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)zc->workSpace;
                zc->blockState.nextCBlock = zc->blockState.prevCBlock + 1;
                ptr = zc->blockState.nextCBlock + 1;
                zc->entropyWorkspace = (U32*)ptr;
        }   }

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        ptr = zc->entropyWorkspace + HUF_WORKSPACE_SIZE_U32;

        /* ldm hash table */
        /* initialize bucketOffsets table later for pointer alignment */
        if (params.ldmParams.enableLdm) {
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            memset(ptr, 0, ldmHSize * sizeof(ldmEntry_t));
            assert(((size_t)ptr & 3) == 0); /* ensure ptr is properly aligned */
            zc->ldmState.hashTable = (ldmEntry_t*)ptr;
            ptr = zc->ldmState.hashTable + ldmHSize;
            zc->ldmSequences = (rawSeq*)ptr;
            ptr = zc->ldmSequences + maxNbLdmSeq;
            zc->maxNbLdmSequences = maxNbLdmSeq;

            memset(&zc->ldmState.window, 0, sizeof(zc->ldmState.window));
        }
        assert(((size_t)ptr & 3) == 0); /* ensure ptr is properly aligned */

        ptr = ZSTD_reset_matchState(&zc->blockState.matchState, ptr, &params.cParams, crp, /* forCCtx */ 1);

        /* sequences storage */
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.sequencesStart = (seqDef*)ptr;
        ptr = zc->seqStore.sequencesStart + maxNbSeq;
        zc->seqStore.llCode = (BYTE*) ptr;
        zc->seqStore.mlCode = zc->seqStore.llCode + maxNbSeq;
        zc->seqStore.ofCode = zc->seqStore.mlCode + maxNbSeq;
        zc->seqStore.litStart = zc->seqStore.ofCode + maxNbSeq;
        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.maxNbLit = blockSize;
        ptr = zc->seqStore.litStart + blockSize + WILDCOPY_OVERLENGTH;

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            memset(ptr, 0, ldmBucketSize);
            zc->ldmState.bucketOffsets = (BYTE*)ptr;
            ptr = zc->ldmState.bucketOffsets + ldmBucketSize;
            ZSTD_window_clear(&zc->ldmState.window);
        }
        ZSTD_referenceExternalSequences(zc, NULL, 0);

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ptr;
        zc->outBuffSize = buffOutSize;
        zc->outBuff = zc->inBuff + buffInSize;

        return 0;
    }
}